

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
~RegistryWithPred(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this_local;
  
  (this->
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  ).super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_001938d8;
  (*(this->
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    ).super_ThreadSafe._vptr_ThreadSafe[0xd])();
  AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  ::~AbstractRegistry(&this->
                       super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                     );
  return;
}

Assistant:

virtual ~RegistryWithPred(void) {
    unregisterAll();
  }